

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O1

void __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::perform_dwarf_fission_resolution
          (dwarf_resolver *this,die_object *cu_die,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
          *dwo_name,object_frame *object_frame_info,stacktrace_frame *frame,
          vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *inlines)

{
  _Hash_node_base *p_Var1;
  long *plVar2;
  pointer psVar3;
  pointer psVar4;
  undefined1 auVar5 [8];
  undefined1 auVar6 [8];
  cache_mode cVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  Dwarf_Debug pDVar9;
  Dwarf_Debug this_00;
  _Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false>
  _Var10;
  int __flags;
  object_frame *poVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  void *__child_stack;
  void *__child_stack_00;
  stacktrace_frame *__arg;
  void *__arg_00;
  __node_base_ptr p_Var13;
  __node_base_ptr p_Var14;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false,_false>,_bool>
  pVar15;
  source_location location;
  source_location location_00;
  Dwarf_Half dwversion;
  Dwarf_Half offset_size;
  string path;
  frame_with_inlines res;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
  comp_dir;
  Dwarf_Off off;
  dwarf_resolver resolver;
  undefined4 in_stack_fffffffffffffc98;
  Dwarf_Half DVar16;
  Dwarf_Half DVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  undefined1 local_338 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  bool local_2e0;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> local_2d8;
  anon_union_32_2_d41c7fdf_for_optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>_2
  local_2c0;
  bool local_2a0;
  undefined1 local_298 [22];
  undefined2 uStack_282;
  undefined1 local_280 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  bool local_240;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> local_238;
  anon_union_32_2_d41c7fdf_for_optional<cpptrace::detail::libdwarf::skeleton_info,_0>_2 local_218;
  char local_1f8;
  anon_union_32_2_d41c7fdf_for_optional<cpptrace::detail::libdwarf::skeleton_info,_0>_2 local_1f0;
  char local_1d0;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> local_1c8;
  undefined1 local_1a8 [16];
  undefined1 local_198 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_150;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> local_148 [11];
  
  if (dwo_name->holds_value != true) {
    return;
  }
  poVar11 = object_frame_info;
  __arg = frame;
  die_object::get_string_attribute_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              *)&local_2c0,cu_die,0x1b);
  __flags = (int)poVar11;
  DVar17 = 0;
  DVar16 = 0;
  dwarf_get_version_of_die
            (cu_die->die,(Dwarf_Half *)&stack0xfffffffffffffc9c,
             (Dwarf_Half *)&stack0xfffffffffffffc9e);
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  local_358._M_string_length = 0;
  local_358.field_2._M_local_buf[0] = '\0';
  if (dwo_name->holds_value == false) {
    location._8_8_ = "Optional does not contain a value";
    location.file = (char *)0x130;
    assert_fail((detail *)0x0,0x1d8c98,
                "const T &cpptrace::detail::optional<std::basic_string<char>>::unwrap() const & [T = std::basic_string<char>]"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/utils/utils.hpp"
                ,location,(char *)CONCAT26(DVar17,CONCAT24(DVar16,in_stack_fffffffffffffc98)));
  }
  if (((dwo_name->field_0).uvalue._M_string_length == 0) || (**(char **)&dwo_name->field_0 != '/'))
  {
    if (local_2a0 != true) goto LAB_0017f879;
    local_338._0_8_ = local_338 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_338,local_2c0.uvalue._M_dataplus._M_p,
               (pointer)(local_2c0.uvalue._M_string_length + (long)local_2c0.uvalue._M_dataplus._M_p
                        ));
    __arg = (stacktrace_frame *)0x2f;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
               local_338._8_8_,0,1,'/');
    if (dwo_name->holds_value == false) {
      location_00._8_8_ = "Optional does not contain a value";
      location_00.file = (char *)0x130;
      assert_fail((detail *)0x0,0x1d8c98,
                  "const T &cpptrace::detail::optional<std::basic_string<char>>::unwrap() const & [T = std::basic_string<char>]"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/utils/utils.hpp"
                  ,location_00,(char *)CONCAT26(DVar17,CONCAT24(DVar16,in_stack_fffffffffffffc98)));
    }
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338,(dwo_name->field_0).uvalue._M_dataplus._M_p,
                       (dwo_name->field_0).uvalue._M_string_length);
    local_1a8._0_8_ = (pbVar8->_M_dataplus)._M_p;
    paVar12 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ == paVar12) {
      local_198 = (undefined1  [8])paVar12->_M_allocated_capacity;
      bStack_190._M_dataplus._M_p = *(pointer *)((long)&pbVar8->field_2 + 8);
      local_1a8._0_8_ = (pointer)(local_1a8 + 0x10);
    }
    else {
      local_198 = (undefined1  [8])paVar12->_M_allocated_capacity;
    }
    local_1a8._8_8_ = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_358,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
    __flags = (int)paVar12;
    if ((pointer)local_1a8._0_8_ != (pointer)(local_1a8 + 0x10)) {
      operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
    }
    if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
      operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_358,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dwo_name);
  }
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  local_320._M_string_length = 0;
  local_320.field_2._M_local_buf[0] = '\0';
  local_300._M_string_length = 0;
  local_300.field_2._M_local_buf[0] = '\0';
  local_2d8.
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  cVar7 = get_cache_mode();
  if (cVar7 == prioritize_memory) {
    die_object::clone((die_object *)local_298,(__fn *)cu_die,__child_stack,__flags,__arg);
    psVar3 = stack0xfffffffffffffd78;
    stack0xfffffffffffffd78 = (pointer)CONCAT62(stack0xfffffffffffffd7a,DVar16);
    psVar4 = stack0xfffffffffffffd78;
    local_1d0 = '\x01';
    local_1f0.uvalue.cu_die.dbg = (Dwarf_Debug)local_298._0_8_;
    local_1f0.uvalue.cu_die.die = (Dwarf_Die)local_298._8_8_;
    local_298._0_8_ = (Dwarf_Debug)0x0;
    local_298._8_8_ = (pointer)0x0;
    local_298._18_4_ = SUB84(psVar3,2);
    local_1f0._18_4_ = local_298._18_4_;
    uStack_282 = SUB82(psVar3,6);
    local_1f0._22_2_ = uStack_282;
    unique0x1000106a = psVar4;
    local_280._0_8_ = this;
    local_1f0.uvalue.dwversion = DVar16;
    local_1f0.uvalue.resolver = this;
    dwarf_resolver((dwarf_resolver *)local_1a8,&local_358,
                   (optional<cpptrace::detail::libdwarf::skeleton_info,_0> *)&local_1f0.uvalue);
    if (local_1d0 == '\x01') {
      die_object::~die_object(&local_1f0.uvalue.cu_die);
    }
    local_1d0 = 0;
    die_object::~die_object((die_object *)local_298);
    resolve_frame((frame_with_inlines *)local_298,(dwarf_resolver *)local_1a8,object_frame_info);
    local_338._16_8_ = stack0xfffffffffffffd78;
    local_338._0_8_ = local_298._0_8_;
    local_338._8_8_ = local_298._8_8_;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_338 + 0x18),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_300,&local_260);
    local_1c8.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_2d8.
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1c8.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_2d8.
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1c8.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_2d8.
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_2e0 = local_240;
    local_2d8.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_238.
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_2d8.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_238.
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_2d8.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_238.
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_238.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
              (&local_1c8);
    std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
              (&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((dwarf_resolver *)local_280._0_8_ != (dwarf_resolver *)(local_280 + 0x10)) {
      operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
    }
    ~dwarf_resolver((dwarf_resolver *)local_1a8);
  }
  else {
    pDVar9 = (Dwarf_Debug)die_object::get_global_offset(cu_die);
    __arg_00 = (void *)(this->split_full_cu_resolvers)._M_h._M_bucket_count;
    p_Var13 = (this->split_full_cu_resolvers)._M_h._M_buckets[(ulong)pDVar9 % (ulong)__arg_00];
    p_Var14 = (__node_base_ptr)0x0;
    if ((p_Var13 != (__node_base_ptr)0x0) &&
       (p_Var1 = p_Var13->_M_nxt, p_Var14 = p_Var13,
       pDVar9 != (Dwarf_Debug)p_Var13->_M_nxt[1]._M_nxt)) {
      while (p_Var13 = p_Var1, p_Var1 = p_Var13->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
        p_Var14 = (__node_base_ptr)0x0;
        if (((ulong)p_Var1[1]._M_nxt % (ulong)__arg_00 != (ulong)pDVar9 % (ulong)__arg_00) ||
           (p_Var14 = p_Var13, pDVar9 == (Dwarf_Debug)p_Var1[1]._M_nxt)) goto LAB_0017f58f;
      }
      p_Var14 = (__node_base_ptr)0x0;
    }
LAB_0017f58f:
    if (p_Var14 == (__node_base_ptr)0x0) {
      _Var10._M_cur = (__node_type *)0x0;
    }
    else {
      _Var10._M_cur = (__node_type *)p_Var14->_M_nxt;
    }
    local_1c8.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)pDVar9;
    if (_Var10._M_cur == (__node_type *)0x0) {
      this_00 = (Dwarf_Debug)operator_new(0x170);
      die_object::clone((die_object *)local_1a8,(__fn *)cu_die,__child_stack_00,(int)pDVar9,__arg_00
                       );
      auVar5 = local_198;
      local_198._0_2_ = DVar16;
      auVar6 = local_198;
      local_1f8 = '\x01';
      local_218.uvalue.cu_die.dbg = (Dwarf_Debug)local_1a8._0_8_;
      local_218.uvalue.cu_die.die = (Dwarf_Die)local_1a8._8_8_;
      local_1a8._0_8_ = (pointer)0x0;
      local_1a8._8_8_ = (pointer)0x0;
      local_198._2_4_ = auVar5._2_4_;
      local_218._18_4_ = local_198._2_4_;
      local_198._6_2_ = auVar5._6_2_;
      local_218._22_2_ = local_198._6_2_;
      local_218.uvalue.dwversion = DVar16;
      local_218.uvalue.resolver = this;
      local_198 = auVar6;
      bStack_190._M_dataplus._M_p = (pointer)this;
      dwarf_resolver((dwarf_resolver *)this_00,&local_358,
                     (optional<cpptrace::detail::libdwarf::skeleton_info,_0> *)&local_218.uvalue);
      local_298._0_8_ = this_00;
      pVar15 = std::
               _Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>>,std::allocator<std::pair<unsigned_long_long_const,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               ::
               _M_emplace<unsigned_long_long&,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>>
                         ((_Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>>,std::allocator<std::pair<unsigned_long_long_const,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                           *)&this->split_full_cu_resolvers,&local_1c8);
      _Var10._M_cur =
           (__node_type *)
           pVar15.first.
           super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false>
           ._M_cur;
      if ((Dwarf_Debug)local_298._0_8_ != (Dwarf_Debug)0x0) {
        (*((symbol_resolver *)local_298._0_8_)->_vptr_symbol_resolver[1])();
      }
      local_298._0_8_ = (Dwarf_Debug)0x0;
      if (local_1f8 == '\x01') {
        die_object::~die_object(&local_218.uvalue.cu_die);
      }
      local_1f8 = 0;
      die_object::~die_object((die_object *)local_1a8);
    }
    plVar2 = *(long **)((long)&((_Var10._M_cur)->
                               super__Hash_node_value<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>_>
                               ._M_storage._M_storage + 8);
    (**(code **)(*plVar2 + 0x10))(local_1a8,plVar2,object_frame_info);
    local_338._16_8_ = local_198;
    local_338._0_8_ = local_1a8._0_8_;
    local_338._8_8_ = local_1a8._8_8_;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_338 + 0x18),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_198 + 8))
    ;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_300,&local_170);
    unique0x10000fe2 =
         local_2d8.
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_298._8_8_ =
         local_2d8.
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_298._0_8_ =
         local_2d8.
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_2e0 = (bool)local_150;
    local_2d8.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_148[0].
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_2d8.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_148[0].
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_2d8.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_148[0].
         super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_148[0].
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148[0].
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148[0].
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
              ((vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
               local_298);
    std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
              (local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bStack_190._M_dataplus._M_p != &bStack_190.field_2) {
      operator_delete(bStack_190._M_dataplus._M_p,
                      (ulong)(bStack_190.field_2._M_allocated_capacity + 1));
    }
  }
  frame->line = (nullable<unsigned_int,_0>)local_338._16_4_;
  frame->column = (nullable<unsigned_int,_0>)local_338._20_4_;
  frame->raw_address = local_338._0_8_;
  frame->object_address = local_338._8_8_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&frame->filename,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_338 + 0x18)
            );
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&frame->symbol,&local_300);
  frame->is_inline = local_2e0;
  local_1a8._0_8_ =
       (inlines->
       super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       (inlines->
       super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_198 = (undefined1  [8])
              (inlines->
              super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (inlines->
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>).
  _M_impl.super__Vector_impl_data._M_start =
       local_2d8.
       super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (inlines->
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>).
  _M_impl.super__Vector_impl_data._M_finish =
       local_2d8.
       super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (inlines->
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_2d8.
       super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2d8.
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
            ((vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
             local_1a8);
  std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
            (&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,
                    CONCAT71(local_300.field_2._M_allocated_capacity._1_7_,
                             local_300.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,
                    CONCAT71(local_320.field_2._M_allocated_capacity._1_7_,
                             local_320.field_2._M_local_buf[0]) + 1);
  }
LAB_0017f879:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,
                    CONCAT71(local_358.field_2._M_allocated_capacity._1_7_,
                             local_358.field_2._M_local_buf[0]) + 1);
  }
  if ((local_2a0 == true) &&
     (local_2c0.uvalue._M_dataplus._M_p != (_Alloc_hider)((long)&local_2c0.uvalue + 0x10))) {
    operator_delete((void *)local_2c0.uvalue._M_dataplus._M_p,local_2c0._16_8_ + 1);
  }
  return;
}

Assistant:

void perform_dwarf_fission_resolution(
            const die_object& cu_die,
            const optional<std::string>& dwo_name,
            const object_frame& object_frame_info,
            stacktrace_frame& frame,
            std::vector<stacktrace_frame>& inlines
        ) {
            // Split dwarf / debug fission / dwo is handled here
            // Location of the split full CU is a combination of DW_AT_dwo_name/DW_AT_GNU_dwo_name and DW_AT_comp_dir
            // https://gcc.gnu.org/wiki/DebugFission
            if(dwo_name) {
                // TODO: DWO ID?
                auto comp_dir = cu_die.get_string_attribute(DW_AT_comp_dir);
                Dwarf_Half offset_size = 0;
                Dwarf_Half dwversion = 0;
                dwarf_get_version_of_die(cu_die.get(), &dwversion, &offset_size);
                std::string path;
                if(is_absolute(dwo_name.unwrap())) {
                    path = dwo_name.unwrap();
                } else if(comp_dir) {
                    path = comp_dir.unwrap() + PATH_SEP + dwo_name.unwrap();
                } else {
                    // maybe default to dwo_name but for now not doing anything
                    return;
                }
                // todo: slight inefficiency in this copy-back strategy due to other frame members
                frame_with_inlines res;
                if(get_cache_mode() == cache_mode::prioritize_memory) {
                    dwarf_resolver resolver(
                        path,
                        skeleton_info{cu_die.clone(), dwversion, *this}
                    );
                    res = resolver.resolve_frame(object_frame_info);
                } else {
                    auto off = cu_die.get_global_offset();
                    auto it = split_full_cu_resolvers.find(off);
                    if(it == split_full_cu_resolvers.end()) {
                        it = split_full_cu_resolvers.emplace(
                            off,
                            std::unique_ptr<dwarf_resolver>(
                                new dwarf_resolver(
                                    path,
                                    skeleton_info{cu_die.clone(), dwversion, *this}
                                )
                            )
                        ).first;
                    }
                    res = it->second->resolve_frame(object_frame_info);
                }
                frame = std::move(res.frame);
                inlines = std::move(res.inlines);
            }
        }